

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ted_algorithm_touzet.h
# Opt level: O0

int __thiscall
ted::TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
e_budget(TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
         *this,TreeIndexAll *t1,TreeIndexAll *t2,int x,int y,int k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  int iVar5;
  int iVar6;
  int lower_bound;
  int y_size;
  int x_size;
  int k_local;
  int y_local;
  int x_local;
  TreeIndexAll *t2_local;
  TreeIndexAll *t1_local;
  TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  *this_local;
  
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PostLToSize).postl_to_size_,(long)x);
  iVar6 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PostLToSize).postl_to_size_,(long)y);
  iVar1 = *pvVar4;
  iVar3 = (t1->super_Constants).tree_size_;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PostLToDepth).postl_to_depth_,(long)x);
  iVar5 = *pvVar4;
  iVar2 = (t2->super_Constants).tree_size_;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PostLToDepth).postl_to_depth_,(long)y);
  iVar3 = ((iVar3 - (x + 1)) - iVar5) - ((iVar2 - (y + 1)) - *pvVar4);
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PostLToDepth).postl_to_depth_,(long)x);
  iVar5 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PostLToDepth).postl_to_depth_,(long)y);
  iVar5 = iVar5 - *pvVar4;
  if (iVar5 < 1) {
    iVar5 = -iVar5;
  }
  iVar6 = ((x + 1) - iVar6) - ((y + 1) - iVar1);
  if (iVar6 < 1) {
    iVar6 = -iVar6;
  }
  return k - (iVar3 + iVar5 + iVar6);
}

Assistant:

int e_budget(const TreeIndex& t1, const TreeIndex& t2, const int x, const int y, const int k) const {
    // Lower bound formula (k - RA - L):
    // e(x,y) = k - |(|T1|-(x+1))-(|T2|-(y+1))| - |((x+1)-|T1_x|)-((y+1)-|T2_y|)|
    // New lower bound formula (k - R - A - L):
    // e(x,y) = k - |(|T1|-(x+1)-depth(x))-(|T2|-(y+1)-depth(y))| - |depth(x)-depth(y)| - |((x+1)-|T1_x|)-((y+1)-|T2_y|)|
    int x_size = t1.postl_to_size_[x];
    int y_size = t2.postl_to_size_[y];
    // int lower_bound = std::abs((t1_size_.back() - (x+1)) - (t2_size_.back() - (y+1))) +
    //                   std::abs(((x+1) - x_size) - ((y+1) - y_size));
    int lower_bound = std::abs((t1.tree_size_ - (x+1) - t1.postl_to_depth_[x]) -
        (t2.tree_size_ - (y+1) - t2.postl_to_depth_[y])) +
        std::abs(t1.postl_to_depth_[x] - t2.postl_to_depth_[y]) +
        std::abs(((x+1) - x_size) - ((y+1) - y_size));
    return (k - lower_bound); // TODO: Verify this -> BUG: There is a bug here possibly returning a negative number.
  }